

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_bool(qpdf_data qpdf,QPDF_BOOL value)

{
  qpdf_oh qVar1;
  bool in_stack_ffffffffffffffdf;
  QPDFObjectHandle local_20;
  
  QPDFObjectHandle::newBool(in_stack_ffffffffffffffdf);
  qVar1 = new_object(qpdf,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_bool(qpdf_data qpdf, QPDF_BOOL value)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_bool");
    return new_object(qpdf, QPDFObjectHandle::newBool(value));
}